

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta,float obj_amp)

{
  int *args_1;
  undefined1 auVar1 [16];
  bool bVar2;
  rc_size rVar3;
  bool bVar4;
  uint r_size;
  long lVar5;
  uint uVar6;
  undefined1 auVar7 [64];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  float local_78;
  float theta_local;
  float delta_local;
  float kappa_local;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 extraout_var [60];
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_78 = obj_amp;
  theta_local = theta;
  delta_local = delta;
  kappa_local = kappa;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&kappa_local,&delta_local,&theta_local);
  bVar4 = false;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    k = (first._M_current)->first;
    sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)this + 0x10);
    solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
    ::decrease_preference
              ((solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                *)this,it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,
               (row_iterator)
               it.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
               .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
               super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl,
               theta_local);
    rVar3 = solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
            ::compute_reduced_costs<baryonyx::bit_array>
                      ((solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                        *)this,it.
                               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                               .
                               super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                               ._M_head_impl,
                       (row_iterator)
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
                       super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,x);
    for (lVar5 = 0; ((ulong)rVar3 & 0xffffffff) * 0xc - lVar5 != 0; lVar5 = lVar5 + 0xc) {
      auVar7._0_4_ = quadratic_cost_type<float>::operator()
                               (*(quadratic_cost_type<float> **)(this + 0x78),
                                it.
                                super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                                .
                                super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                ._M_head_impl[*(int *)(*(long *)(this + 0x60) + 8 + lVar5)].column,x
                               );
      auVar7._4_60_ = extraout_var;
      auVar1 = vfmadd213ss_fma(auVar7._0_16_,ZEXT416((uint)local_78),
                               ZEXT416(*(uint *)(*(long *)(this + 0x60) + lVar5)));
      *(int *)(*(long *)(this + 0x60) + lVar5) = auVar1._0_4_;
    }
    r_size = rVar3.r_size;
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>
              (*(rc_data **)(this + 0x60),*(rc_data **)(this + 0x60) + (int)r_size,
               *(random_engine **)(this + 8));
    args_1 = (int *)(*(long *)(this + 0x68) + (long)k * 8);
    uVar6 = rVar3.c_size + *args_1;
    if ((int)r_size < (int)uVar6) {
      uVar6 = r_size;
    }
    selected = uVar6 - 1;
    fmt_00._M_str = "constraints {}: {} = ";
    fmt_00._M_len = 0x15;
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&k,args_1);
    for (lVar5 = 0; (ulong)(~((int)r_size >> 0x1f) & r_size) * 0xc - lVar5 != 0; lVar5 = lVar5 + 0xc
        ) {
      fmt_01._M_str = "{} ({}) ";
      fmt_01._M_len = 8;
      debug_logger<true>::log<float,int>
                ((debug_logger<true> *)this,fmt_01,(float *)(*(long *)(this + 0x60) + lVar5),
                 (int *)(*(long *)(this + 0x60) + 8 + lVar5));
    }
    fmt_02._M_str = " => Selected: {}\n";
    fmt_02._M_len = 0x11;
    debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&selected);
    bVar2 = affect<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                      ((solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                        *)this,x,
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,k,selected,r_size,kappa_local,delta_local);
    bVar4 = (bool)(bVar4 | bVar2);
  }
  return bVar4;
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }